

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O2

void __thiscall
StringType::GenCheckingCStr(StringType *this,Output *out_cc,Env *env,DataPtr *data,string *str_size)

{
  string str_val;
  string local_70;
  undefined8 local_50 [4];
  
  Type::GenBoundaryCheck(&this->super_Type,out_cc,env,data);
  std::__cxx11::string::string((string *)local_50,(string *)&this->str_->str_);
  Output::println(out_cc,"if ( memcmp(%s, %s, %s) != 0 )",(data->ptr_expr_)._M_dataplus._M_p,
                  local_50[0],(str_size->_M_dataplus)._M_p);
  out_cc->indent_ = out_cc->indent_ + 1;
  Output::println(out_cc,"{");
  std::__cxx11::string::string((string *)&local_70,(string *)local_50);
  GenStringMismatch(this,out_cc,env,data,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  Output::println(out_cc,"}");
  out_cc->indent_ = out_cc->indent_ + -1;
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void StringType::GenCheckingCStr(Output* out_cc, Env* env, const DataPtr& data,
                                 const string& str_size)
	{
	// TODO: extend it for dynamic strings
	ASSERT(type_ == CSTR);

	GenBoundaryCheck(out_cc, env, data);

	string str_val = str_->str();

	// Compare the string and report error on mismatch
	out_cc->println("if ( memcmp(%s, %s, %s) != 0 )", data.ptr_expr(), str_val.c_str(),
	                str_size.c_str());
	out_cc->inc_indent();
	out_cc->println("{");
	GenStringMismatch(out_cc, env, data, str_val);
	out_cc->println("}");
	out_cc->dec_indent();
	}